

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

bool __thiscall
ON_Mesh::ModifyNgon(ON_Mesh *this,uint ngon_index,uint Vcount,uint *ngon_vi,uint Fcount,
                   uint *ngon_fi)

{
  bool bVar1;
  ON_MeshNgon local_18;
  
  local_18.m_Vcount = Vcount;
  local_18.m_Fcount = Fcount;
  local_18.m_vi = ngon_vi;
  local_18.m_fi = ngon_fi;
  bVar1 = ModifyNgon(this,ngon_index,&local_18);
  return bVar1;
}

Assistant:

bool ON_Mesh::ModifyNgon(
  unsigned int ngon_index,
  unsigned int Vcount, 
  const unsigned int* ngon_vi,
  unsigned int Fcount, 
  const unsigned int* ngon_fi
  )
{
  ON_MeshNgon ngon;
  ngon.m_Vcount = Vcount;
  ngon.m_vi = (unsigned int*)ngon_vi;
  ngon.m_Fcount = Fcount;
  ngon.m_fi = (unsigned int*)ngon_fi;
  bool rc = ModifyNgon(ngon_index,&ngon);
  ngon.m_vi = 0;
  ngon.m_fi = 0;
  return rc;
}